

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderResult
BrotliDecoderDecompress
          (size_t encoded_size,uint8_t *encoded_buffer,size_t *decoded_size,uint8_t *decoded_buffer)

{
  BrotliDecoderResult BVar1;
  size_t available_in;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t total_out;
  BrotliDecoderStateInternal s;
  size_t local_1480;
  uint8_t *local_1478;
  size_t local_1470;
  uint8_t *local_1468;
  size_t local_1460;
  BrotliDecoderStateInternal local_1458;
  
  local_1460 = 0;
  local_1470 = *decoded_size;
  local_1480 = encoded_size;
  local_1478 = decoded_buffer;
  local_1468 = encoded_buffer;
  BrotliDecoderStateInit(&local_1458);
  BVar1 = BrotliDecoderDecompressStream
                    (&local_1458,&local_1480,&local_1468,&local_1470,&local_1478,&local_1460);
  *decoded_size = local_1460;
  BrotliDecoderStateCleanup(&local_1458);
  return (BrotliDecoderResult)(BVar1 == BROTLI_DECODER_RESULT_SUCCESS);
}

Assistant:

BrotliDecoderResult BrotliDecoderDecompress(
    size_t encoded_size, const uint8_t* encoded_buffer, size_t* decoded_size,
    uint8_t* decoded_buffer) {
  BrotliDecoderState s;
  BrotliDecoderResult result;
  size_t total_out = 0;
  size_t available_in = encoded_size;
  const uint8_t* next_in = encoded_buffer;
  size_t available_out = *decoded_size;
  uint8_t* next_out = decoded_buffer;
  BrotliDecoderStateInit(&s);
  result = BrotliDecoderDecompressStream(
      &s, &available_in, &next_in, &available_out, &next_out, &total_out);
  *decoded_size = total_out;
  BrotliDecoderStateCleanup(&s);
  if (result != BROTLI_DECODER_RESULT_SUCCESS) {
    result = BROTLI_DECODER_RESULT_ERROR;
  }
  return result;
}